

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O0

void __thiscall Glucose::bqueue<unsigned_int>::initSize(bqueue<unsigned_int> *this,int size)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  growTo((bqueue<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
         (int)((ulong)in_RDI >> 0x20));
  *(double *)(in_RDI + 0x30) = 2.0 / (double)(in_ESI + 1);
  return;
}

Assistant:

void initSize(int size) {growTo(size);exp = 2.0/(size+1);}